

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_log(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  __type_conflict2 _Var3;
  CHAR_DATA *victim;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  ulong uVar4;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  
  one_argument(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffede8,"all");
    if (bVar1) {
      pCVar2 = get_char_world((CHAR_DATA *)arg._4568_8_,(char *)arg._4560_8_);
      if (pCVar2 == (CHAR_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
      }
      else {
        bVar1 = is_npc(in_stack_ffffffffffffedd8);
        if (bVar1) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
        }
        else {
          uVar4 = pCVar2->act[0];
          _Var3 = std::pow<int,int>(0,0x595600);
          if ((uVar4 & (long)_Var3) == 0) {
            _Var3 = std::pow<int,int>(0,0x595662);
            pCVar2->act[0] = (long)_Var3 | pCVar2->act[0];
            send_to_char(in_stack_ffffffffffffedf0,
                         (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8))
            ;
          }
          else {
            _Var3 = std::pow<int,int>(0,0x595621);
            pCVar2->act[0] = ((long)_Var3 ^ 0xffffffffffffffffU) & pCVar2->act[0];
            send_to_char(in_stack_ffffffffffffedf0,
                         (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8))
            ;
          }
        }
      }
    }
    else if ((fLogAll & 1U) == 0) {
      fLogAll = true;
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      fLogAll = false;
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
  }
  return;
}

Assistant:

void do_log(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Log whom?\n\r", ch);
		return;
	}

	if (!str_cmp(arg, "all"))
	{
		if (fLogAll)
		{
			fLogAll = false;
			send_to_char("Log ALL off.\n\r", ch);
		}
		else
		{
			fLogAll = true;
			send_to_char("Log ALL on.\n\r", ch);
		}

		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	/*
	 * No level check, gods can log anyone.
	 */
	if (IS_SET(victim->act, PLR_LOG))
	{
		REMOVE_BIT(victim->act, PLR_LOG);
		send_to_char("LOG removed.\n\r", ch);
	}
	else
	{
		SET_BIT(victim->act, PLR_LOG);
		send_to_char("LOG set.\n\r", ch);
	}
}